

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToString.hpp
# Opt level: O0

ParseIterableToString<std::vector<ut11::Category,std::allocator<ut11::Category>>> * __thiscall
ut11::utility::detail::
ParseIterableToString<std::vector<ut11::Category,std::allocator<ut11::Category>>>::
operator()[abi_cxx11_
          (ParseIterableToString<std::vector<ut11::Category,std::allocator<ut11::Category>>> *this,
          vector<ut11::Category,_std::allocator<ut11::Category>_> *value)

{
  bool bVar1;
  ostream *poVar2;
  vector<ut11::Category,_std::allocator<ut11::Category>_> *in_RDX;
  utility local_1f8 [32];
  reference local_1d8;
  Category *arg;
  const_iterator __end0;
  const_iterator __begin0;
  vector<ut11::Category,_std::allocator<ut11::Category>_> *__range3;
  stringstream local_1a8 [8];
  stringstream stream;
  ostream local_198 [376];
  vector<ut11::Category,_std::allocator<ut11::Category>_> *local_20;
  vector<ut11::Category,_std::allocator<ut11::Category>_> *value_local;
  ParseIterableToString<std::vector<ut11::Category,_std::allocator<ut11::Category>_>_> *this_local;
  
  local_20 = in_RDX;
  value_local = value;
  this_local = (ParseIterableToString<std::vector<ut11::Category,_std::allocator<ut11::Category>_>_>
                *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"{ ");
  __end0 = std::vector<ut11::Category,_std::allocator<ut11::Category>_>::begin(local_20);
  arg = (Category *)std::vector<ut11::Category,_std::allocator<ut11::Category>_>::end(local_20);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_ut11::Category_*,_std::vector<ut11::Category,_std::allocator<ut11::Category>_>_>
                                *)&arg);
    if (!bVar1) break;
    local_1d8 = __gnu_cxx::
                __normal_iterator<const_ut11::Category_*,_std::vector<ut11::Category,_std::allocator<ut11::Category>_>_>
                ::operator*(&__end0);
    ToString<ut11::Category>(local_1f8,local_1d8);
    poVar2 = std::operator<<(local_198,(string *)local_1f8);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string((string *)local_1f8);
    __gnu_cxx::
    __normal_iterator<const_ut11::Category_*,_std::vector<ut11::Category,_std::allocator<ut11::Category>_>_>
    ::operator++(&__end0);
  }
  std::operator<<(local_198,"}");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

inline std::string operator()(const V& value) const
				{
					std::stringstream stream;
					stream << "{ ";
					for (const auto& arg : value)
						stream << ToString(arg) << " ";
					stream << "}";
					return stream.str();
				}